

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256.c
# Opt level: O1

uint64_t * Hacl_Bignum256_new_bn_from_bytes_le(uint32_t len,uint8_t *b)

{
  long lVar1;
  uint8_t *__src;
  uint64_t *__dest;
  ulong __n;
  size_t __n_00;
  undefined1 *__dest_00;
  uint uVar2;
  undefined8 uStack_50;
  undefined1 auStack_48 [8];
  undefined1 *local_40;
  uint8_t *local_38;
  
  if (len != 0) {
    uVar2 = len - 1 >> 3;
    if (uVar2 != 0x1fffffff) {
      uVar2 = uVar2 + 1;
      uStack_50 = 0x13d9bc;
      __dest = (uint64_t *)calloc((ulong)uVar2,8);
      if (__dest == (uint64_t *)0x0) {
        return (uint64_t *)0x0;
      }
      uVar2 = uVar2 * 8;
      lVar1 = -((ulong)uVar2 + 0xf & 0xfffffffffffffff0);
      __dest_00 = auStack_48 + lVar1;
      __n = (ulong)len;
      __n_00 = uVar2 - __n;
      if (uVar2 <= len) {
        __n_00 = 0;
      }
      local_40 = auStack_48;
      local_38 = b;
      *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x13da01;
      memset(__dest_00 + __n,0,__n_00);
      __src = local_38;
      *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x13da10;
      memcpy(__dest_00,__src,__n);
      *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x13da26;
      memcpy(__dest,__dest_00,(ulong)(len - 1 & 0xfffffff8) + 8);
      return __dest;
    }
  }
  return (uint64_t *)0x0;
}

Assistant:

uint64_t *Hacl_Bignum256_new_bn_from_bytes_le(uint32_t len, uint8_t *b)
{
  if (len == 0U || !((len - 1U) / 8U + 1U <= 536870911U))
  {
    return NULL;
  }
  KRML_CHECK_SIZE(sizeof (uint64_t), (len - 1U) / 8U + 1U);
  uint64_t *res = (uint64_t *)KRML_HOST_CALLOC((len - 1U) / 8U + 1U, sizeof (uint64_t));
  if (res == NULL)
  {
    return res;
  }
  uint64_t *res1 = res;
  uint64_t *res2 = res1;
  uint32_t bnLen = (len - 1U) / 8U + 1U;
  uint32_t tmpLen = 8U * bnLen;
  KRML_CHECK_SIZE(sizeof (uint8_t), tmpLen);
  uint8_t tmp[tmpLen];
  memset(tmp, 0U, tmpLen * sizeof (uint8_t));
  memcpy(tmp, b, len * sizeof (uint8_t));
  for (uint32_t i = 0U; i < (len - 1U) / 8U + 1U; i++)
  {
    uint64_t *os = res2;
    uint8_t *bj = tmp + i * 8U;
    uint64_t u = load64_le(bj);
    uint64_t r1 = u;
    uint64_t x = r1;
    os[i] = x;
  }
  return res2;
}